

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::ConnectHttpService::ConnectHttpService
          (ConnectHttpService *this,HttpHeaderTable *table)

{
  HttpHeaderTable *requestHeaderTable;
  HttpServerSettings local_78;
  Quantity<long,_kj::_::NanosecondLabel> local_20;
  HttpHeaderTable *local_18;
  HttpHeaderTable *table_local;
  ConnectHttpService *this_local;
  
  local_18 = table;
  table_local = (HttpHeaderTable *)this;
  HttpService::HttpService(&this->super_HttpService);
  (this->super_HttpService)._vptr_HttpService = (_func_int **)&PTR_request_00c054a0;
  local_20.value =
       (long)origin<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>();
  TimerImpl::TimerImpl(&this->timer,(TimePoint)local_20.value);
  SimpleHttpService::SimpleHttpService(&this->tunneledService,local_18);
  requestHeaderTable = local_18;
  local_78.webSocketErrorHandler.ptr = (WebSocketErrorHandler *)0x0;
  local_78.webSocketCompressionMode = NO_COMPRESSION;
  local_78._60_4_ = 0;
  local_78.errorHandler.ptr = (HttpServerErrorHandler *)0x0;
  local_78.callbacks.ptr = (HttpServerCallbacks *)0x0;
  local_78.canceledUploadGracePeriod.value = 0;
  local_78.canceledUploadGraceBytes = 0;
  local_78.headerTimeout.value = 0;
  local_78.pipelineTimeout.value = 0;
  HttpServerSettings::HttpServerSettings(&local_78);
  HttpServer::HttpServer
            (&this->server,&(this->timer).super_Timer,requestHeaderTable,
             &(this->tunneledService).super_HttpService,&local_78);
  return;
}

Assistant:

ConnectHttpService(HttpHeaderTable& table)
      : timer(kj::origin<kj::TimePoint>()),
        tunneledService(table),
        server(timer, table, tunneledService) {}